

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointTrifaceRot::ConstraintsBiLoad_C
          (ChLinkPointTrifaceRot *this,double factor,double recovery_clamp,bool do_clamp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  bool bVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar21;
  undefined1 auVar25 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar36 [16];
  
  auVar26._8_56_ = in_register_00001208;
  auVar26._0_8_ = factor;
  auVar22 = auVar26._0_16_;
  peVar11 = (this->mtriangle).mnodeB1.
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar12 = (this->mtriangle).mnodeB2.
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar21 = *(double *)&(peVar11->super_ChNodeFEAbase).field_0x20;
  dVar15 = *(double *)&(peVar12->super_ChNodeFEAbase).field_0x20 - dVar21;
  dVar16 = *(double *)&peVar12->field_0x28 - *(double *)&peVar11->field_0x28;
  dVar34 = *(double *)&peVar12->field_0x30 - *(double *)&peVar11->field_0x30;
  peVar12 = (this->mtriangle).mnodeB3.
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar21 = *(double *)&(peVar12->super_ChNodeFEAbase).field_0x20 - dVar21;
  dVar17 = *(double *)&peVar12->field_0x28 - *(double *)&peVar11->field_0x28;
  dVar18 = *(double *)&peVar12->field_0x30 - *(double *)&peVar11->field_0x30;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar16;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar18;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar17 * dVar34;
  auVar27 = vfmsub231sd_fma(auVar37,auVar27,auVar35);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar21;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar34;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar18 * dVar15;
  auVar23 = vfmsub231sd_fma(auVar36,auVar29,auVar32);
  dVar34 = auVar23._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar15;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar17;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar21 * dVar16;
  auVar29 = vfmsub231sd_fma(auVar33,auVar23,auVar30);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar34 * dVar34;
  auVar23 = vfmadd231sd_fma(auVar24,auVar27,auVar27);
  auVar23 = vfmadd231sd_fma(auVar23,auVar29,auVar29);
  if (auVar23._0_8_ < 0.0) {
    dVar21 = sqrt(auVar23._0_8_);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = factor;
  }
  else {
    auVar23 = vsqrtsd_avx(auVar23,auVar23);
    dVar21 = auVar23._0_8_;
  }
  bVar20 = 2.2250738585072014e-308 <= dVar21;
  dVar21 = 1.0 / dVar21;
  dVar15 = this->s2;
  dVar16 = this->s3;
  dVar19 = (1.0 - dVar15) - dVar16;
  peVar13 = (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  peVar11 = (this->mtriangle).mnodeB1.
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar17 = *(double *)&peVar11->field_0x28;
  dVar18 = *(double *)&peVar11->field_0x30;
  dVar1 = *(double *)&peVar13->field_0x28;
  dVar2 = *(double *)&peVar13->field_0x30;
  peVar12 = (this->mtriangle).mnodeB2.
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar3 = *(double *)&peVar12->field_0x28;
  dVar4 = *(double *)&peVar12->field_0x30;
  peVar14 = (this->mtriangle).mnodeB3.
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar5 = *(double *)&peVar14->field_0x28;
  dVar6 = *(double *)&peVar14->field_0x30;
  dVar7 = this->d;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (this->constraint1).super_ChConstraint.b_i;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (((*(double *)&(peVar13->super_ChNodeFEAbase).field_0x20 -
         dVar19 * *(double *)&(peVar11->super_ChNodeFEAbase).field_0x20) -
        dVar15 * *(double *)&(peVar12->super_ChNodeFEAbase).field_0x20) -
       dVar16 * *(double *)&(peVar14->super_ChNodeFEAbase).field_0x20) -
       (double)((ulong)bVar20 * (long)(dVar21 * auVar27._0_8_) + (ulong)!bVar20 * 0x3ff0000000000000
               ) * dVar7;
  auVar23 = vfmadd213sd_fma(auVar28,auVar22,auVar8);
  (this->constraint1).super_ChConstraint.b_i = auVar23._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->constraint2).super_ChConstraint.b_i;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (((dVar1 - dVar19 * dVar17) - dVar15 * dVar3) - dVar16 * dVar5) -
       (double)((ulong)bVar20 * (long)(dVar21 * dVar34)) * dVar7;
  auVar23 = vfmadd213sd_fma(auVar31,auVar22,auVar9);
  (this->constraint2).super_ChConstraint.b_i = auVar23._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (this->constraint3).super_ChConstraint.b_i;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (((dVar2 - dVar19 * dVar18) - dVar15 * dVar4) - dVar16 * dVar6) -
       (double)((ulong)bVar20 * (long)(auVar29._0_8_ * dVar21)) * dVar7;
  auVar23 = vfmadd213sd_fma(auVar25,auVar22,auVar10);
  (this->constraint3).super_ChConstraint.b_i = auVar23._0_8_;
  return;
}

Assistant:

void ChLinkPointTrifaceRot::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    // Compute residual of constraint as distance of two points: one is A,
    // other is on triangle at the s2,s3 area coordinates:
    //  C = A - s1*B1 - s2*B2 - s3*B3
    // If an offset d is desired, along normal N, this becomes:
    //  C = A - s1*B1 - s2*B2 - s3*B3 - d*N

    ChVector<> N = Vcross(mtriangle.mnodeB2->coord.pos - mtriangle.mnodeB1->coord.pos,
                          mtriangle.mnodeB3->coord.pos - mtriangle.mnodeB1->coord.pos);
    N.Normalize();
    double s1 = 1 - s2 - s3;

    ChVector<> res = mnodeA->GetPos() - s1 * mtriangle.mnodeB1->coord.pos - s2 * mtriangle.mnodeB2->coord.pos -
                     s3 * mtriangle.mnodeB3->coord.pos - N * d;

    constraint1.Set_b_i(constraint1.Get_b_i() + factor * res.x());
    constraint2.Set_b_i(constraint2.Get_b_i() + factor * res.y());
    constraint3.Set_b_i(constraint3.Get_b_i() + factor * res.z());
}